

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O3

QStyleOptionTitleBar * __thiscall
QMdiSubWindowPrivate::titleBarOptions
          (QStyleOptionTitleBar *__return_storage_ptr__,QMdiSubWindowPrivate *this)

{
  State *pSVar1;
  byte *pbVar2;
  uint uVar3;
  int iVar4;
  QWidget *widget;
  QWidget *pQVar5;
  QArrayData *pQVar6;
  char16_t *pcVar7;
  qsizetype qVar8;
  bool bVar9;
  WindowStates WVar10;
  ColorGroup CVar11;
  int iVar12;
  int iVar13;
  QStyle *pQVar14;
  int iVar15;
  SubControl SVar16;
  int iVar17;
  long in_FS_OFFSET;
  QArrayData *local_58;
  char16_t *pcStack_50;
  qsizetype local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  widget = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  (__return_storage_ptr__->icon).d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&__return_storage_ptr__->titleBarState = &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->text).d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->text).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(__return_storage_ptr__->super_QStyleOptionComplex).subControls =
       &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->text).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)
   &(__return_storage_ptr__->super_QStyleOptionComplex).super_QStyleOption.palette.currentGroup =
       &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->super_QStyleOptionComplex).super_QStyleOption.styleObject =
       (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)
   &(__return_storage_ptr__->super_QStyleOptionComplex).super_QStyleOption.fontMetrics =
       &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->super_QStyleOptionComplex).super_QStyleOption.palette.d =
       (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(__return_storage_ptr__->super_QStyleOptionComplex).super_QStyleOption.rect =
       &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(__return_storage_ptr__->super_QStyleOptionComplex).super_QStyleOption.rect.x2 =
       &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(__return_storage_ptr__->super_QStyleOptionComplex).super_QStyleOption =
       &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(__return_storage_ptr__->super_QStyleOptionComplex).super_QStyleOption.state =
       &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionTitleBar::QStyleOptionTitleBar(__return_storage_ptr__);
  QStyleOption::initFrom((QStyleOption *)__return_storage_ptr__,widget);
  SVar16 = this->activeSubControl;
  if (SVar16 == SC_None) {
    pQVar5 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    pQVar14 = QWidget::style(pQVar5);
    iVar12 = (**(code **)(*(long *)pQVar14 + 0xf0))(pQVar14,0x33,0,pQVar5,0);
    if ((iVar12 == 0) || (SVar16 = this->hoveredSubControl, (SVar16 & ~SC_TitleBarLabel) == SC_None)
       ) {
      pbVar2 = (byte *)((long)&(__return_storage_ptr__->super_QStyleOptionComplex).
                               super_QStyleOption.state.
                               super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                               super_QFlagsStorage<QStyle::StateFlag>.i + 1);
      *pbVar2 = *pbVar2 & 0xdf;
      SVar16 = SC_None;
    }
    else {
      pbVar2 = (byte *)((long)&(__return_storage_ptr__->super_QStyleOptionComplex).
                               super_QStyleOption.state.
                               super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                               super_QFlagsStorage<QStyle::StateFlag>.i + 1);
      *pbVar2 = *pbVar2 | 0x20;
    }
  }
  else {
    if (this->hoveredSubControl != SVar16) goto LAB_0044c96b;
    pSVar1 = &(__return_storage_ptr__->super_QStyleOptionComplex).super_QStyleOption.state;
    *(byte *)&(pSVar1->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
              super_QFlagsStorage<QStyle::StateFlag>.i =
         (byte)(pSVar1->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
               super_QFlagsStorage<QStyle::StateFlag>.i | 4;
  }
  (__return_storage_ptr__->super_QStyleOptionComplex).activeSubControls.
  super_QFlagsStorageHelper<QStyle::SubControl,_4>.super_QFlagsStorage<QStyle::SubControl>.i =
       SVar16;
LAB_0044c96b:
  (__return_storage_ptr__->super_QStyleOptionComplex).subControls.
  super_QFlagsStorageHelper<QStyle::SubControl,_4>.super_QFlagsStorage<QStyle::SubControl>.i =
       0xffffffff;
  (__return_storage_ptr__->titleBarFlags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
  super_QFlagsStorage<Qt::WindowType>.i =
       (widget->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i;
  WVar10 = QWidget::windowState(widget);
  __return_storage_ptr__->titleBarState =
       (int)WVar10.super_QFlagsStorageHelper<Qt::WindowState,_4>.
            super_QFlagsStorage<Qt::WindowState>.i;
  QPalette::operator=(&(__return_storage_ptr__->super_QStyleOptionComplex).super_QStyleOption.
                       palette,&this->titleBarPalette);
  QIcon::operator=(&__return_storage_ptr__->icon,&this->menuIcon);
  uVar3 = (__return_storage_ptr__->super_QStyleOptionComplex).super_QStyleOption.state.
          super_QFlagsStorageHelper<QStyle::StateFlag,_4>.super_QFlagsStorage<QStyle::StateFlag>.i;
  if (this->isActive == true) {
    (__return_storage_ptr__->super_QStyleOptionComplex).super_QStyleOption.state.
    super_QFlagsStorageHelper<QStyle::StateFlag,_4>.super_QFlagsStorage<QStyle::StateFlag>.i =
         uVar3 | 0x10000;
    pbVar2 = (byte *)((long)&__return_storage_ptr__->titleBarState + 2);
    *pbVar2 = *pbVar2 | 1;
    CVar11 = Active;
  }
  else {
    (__return_storage_ptr__->super_QStyleOptionComplex).super_QStyleOption.state.
    super_QFlagsStorageHelper<QStyle::StateFlag,_4>.super_QFlagsStorage<QStyle::StateFlag>.i =
         uVar3 & 0xfffeffff;
    CVar11 = Inactive;
  }
  (__return_storage_ptr__->super_QStyleOptionComplex).super_QStyleOption.palette.currentGroup =
       CVar11;
  pQVar5 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  pQVar14 = QWidget::style(pQVar5);
  iVar12 = (**(code **)(*(long *)pQVar14 + 0xf0))(pQVar14,0x1a,__return_storage_ptr__,pQVar5,0);
  uVar3 = (uint)(iVar12 == 0);
  iVar15 = (uint)(iVar12 != 0) * 4 + -4;
  iVar17 = uVar3 * 4;
  iVar13 = titleBarHeight(this,__return_storage_ptr__);
  bVar9 = QWidget::isMinimized(widget);
  iVar12 = (widget->data->crect).x2.m_i;
  iVar4 = (widget->data->crect).x1.m_i;
  (__return_storage_ptr__->super_QStyleOptionComplex).super_QStyleOption.rect.x1.m_i = iVar17;
  (__return_storage_ptr__->super_QStyleOptionComplex).super_QStyleOption.rect.y1.m_i = iVar17;
  (__return_storage_ptr__->super_QStyleOptionComplex).super_QStyleOption.rect.x2.m_i =
       (iVar15 + iVar12) - iVar4;
  (__return_storage_ptr__->super_QStyleOptionComplex).super_QStyleOption.rect.y2.m_i =
       iVar13 + uVar3 * 4 + (iVar15 << bVar9) + -1;
  if ((this->windowTitle).d.size != 0) {
    QString::operator=(&__return_storage_ptr__->text,(QString *)&this->windowTitle);
    QFontMetrics::QFontMetrics((QFontMetrics *)&local_58,&this->font);
    pQVar6 = *(QArrayData **)
              &(__return_storage_ptr__->super_QStyleOptionComplex).super_QStyleOption.fontMetrics;
    *(QArrayData **)
     &(__return_storage_ptr__->super_QStyleOptionComplex).super_QStyleOption.fontMetrics = local_58;
    local_58 = pQVar6;
    QFontMetrics::~QFontMetrics((QFontMetrics *)&local_58);
    pQVar14 = QWidget::style(widget);
    (**(code **)(*(long *)pQVar14 + 0xd8))(pQVar14,5,__return_storage_ptr__,0x100,widget);
    QFontMetrics::elidedText
              ((QString *)&local_58,(int)__return_storage_ptr__ + 0x20,(int)&this->windowTitle,1);
    pQVar6 = &((__return_storage_ptr__->text).d.d)->super_QArrayData;
    pcVar7 = (__return_storage_ptr__->text).d.ptr;
    (__return_storage_ptr__->text).d.d = (Data *)local_58;
    (__return_storage_ptr__->text).d.ptr = pcStack_50;
    qVar8 = (__return_storage_ptr__->text).d.size;
    (__return_storage_ptr__->text).d.size = local_48;
    local_58 = pQVar6;
    pcStack_50 = pcVar7;
    local_48 = qVar8;
    if (pQVar6 != (QArrayData *)0x0) {
      LOCK();
      (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar6,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStyleOptionTitleBar QMdiSubWindowPrivate::titleBarOptions() const
{
    Q_Q(const QMdiSubWindow);
    QStyleOptionTitleBar titleBarOptions;
    titleBarOptions.initFrom(q);
    if (activeSubControl != QStyle::SC_None) {
        if (hoveredSubControl == activeSubControl) {
            titleBarOptions.state |= QStyle::State_Sunken;
            titleBarOptions.activeSubControls = activeSubControl;
        }
    } else if (autoRaise() && hoveredSubControl != QStyle::SC_None
               && hoveredSubControl != QStyle::SC_TitleBarLabel) {
        titleBarOptions.state |= QStyle::State_MouseOver;
        titleBarOptions.activeSubControls = hoveredSubControl;
    } else {
        titleBarOptions.state &= ~QStyle::State_MouseOver;
        titleBarOptions.activeSubControls = QStyle::SC_None;
    }

    titleBarOptions.subControls = QStyle::SC_All;
    titleBarOptions.titleBarFlags = q->windowFlags();
    titleBarOptions.titleBarState = q->windowState();
    titleBarOptions.palette = titleBarPalette;
    titleBarOptions.icon = menuIcon;

    if (isActive) {
        titleBarOptions.state |= QStyle::State_Active;
        titleBarOptions.titleBarState |= QStyle::State_Active;
        titleBarOptions.palette.setCurrentColorGroup(QPalette::Active);
    } else {
        titleBarOptions.state &= ~QStyle::State_Active;
        titleBarOptions.palette.setCurrentColorGroup(QPalette::Inactive);
    }

    int border = hasBorder(titleBarOptions) ? 4 : 0;
    int paintHeight = titleBarHeight(titleBarOptions);
    paintHeight -= q->isMinimized() ? 2 * border : border;
    titleBarOptions.rect = QRect(border, border, q->width() - 2 * border, paintHeight);

    if (!windowTitle.isEmpty()) {
        // Set the text here before asking for the width of the title bar label
        // in case people uses the actual text to calculate the width.
        titleBarOptions.text = windowTitle;
        titleBarOptions.fontMetrics = QFontMetrics(font);
        int width = q->style()->subControlRect(QStyle::CC_TitleBar, &titleBarOptions,
                                               QStyle::SC_TitleBarLabel, q).width();
        // Set elided text if we don't have enough space for the entire title.
        titleBarOptions.text = titleBarOptions.fontMetrics.elidedText(windowTitle, Qt::ElideRight, width);
    }
    return titleBarOptions;
}